

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

raft_params * __thiscall
nuraft::raft_server::get_current_params(raft_params *__return_storage_ptr__,raft_server *this)

{
  long lVar1;
  raft_params *prVar2;
  byte bVar3;
  element_type *local_20;
  
  bVar3 = 0;
  context::get_params((context *)&stack0xffffffffffffffe0);
  prVar2 = __return_storage_ptr__;
  for (lVar1 = 0x1a; lVar1 != 0; lVar1 = lVar1 + -1) {
    prVar2->election_timeout_upper_bound_ = *(int32 *)&local_20->_vptr_state_mgr;
    local_20 = (element_type *)((long)&local_20[-(ulong)bVar3]._vptr_state_mgr + 4);
    prVar2 = (raft_params *)((long)prVar2 + (ulong)bVar3 * -8 + 4);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return __return_storage_ptr__;
}

Assistant:

raft_params raft_server::get_current_params() const {
    return *ctx_->get_params();
}